

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O0

CNscPStackEntry * NscBuildTranslation(CNscPStackEntry *pList,CNscPStackEntry *pTranslation)

{
  CNscContext *in_RSI;
  CNscPStackEntry *in_stack_ffffffffffffffe8;
  
  if (in_RSI != (CNscContext *)0x0) {
    CNscContext::FreePStackEntry(in_RSI,in_stack_ffffffffffffffe8);
  }
  return (CNscPStackEntry *)0x0;
}

Assistant:

YYSTYPE NscBuildTranslation (YYSTYPE pList, YYSTYPE pTranslation)
{
	pList;

	//
	// Free any entry (probably only declarations)
	//

	if (pTranslation)
        g_pCtx ->FreePStackEntry (pTranslation);

	//
	// Return the new expression
	//

	return NULL;
}